

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O3

bool __thiscall
yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
do_try_lock_sharedwait<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  cv_status cVar1;
  long lVar2;
  bool bVar3;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = (mutex_type *)(this + 0x38);
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  do {
    lVar2 = *(long *)this;
    if (-1 < lVar2) goto LAB_0023d230;
    cVar1 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 8),&local_30,tp);
  } while (cVar1 != timeout);
  lVar2 = *(long *)this;
  if (lVar2 < 0) {
    bVar3 = false;
  }
  else {
LAB_0023d230:
    if (lVar2 == 0x7fffffffffffffff) {
      __assert_fail("(s.rwcount & reader_mask) < reader_mask",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_rwlock_sched.hpp"
                    ,0x5b,"static void yamc::rwlock::ReaderPrefer::acquire_rlock(state &)");
    }
    *(long *)this = lVar2 + 1;
    bVar3 = true;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar3;
}

Assistant:

bool do_try_lock_sharedwait(const std::chrono::time_point<Clock, Duration>& tp)
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    while (RwLockPolicy::wait_rlock(state_)) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (!RwLockPolicy::wait_rlock(state_))  // re-check predicate
          break;
        return false;
      }
    }
    RwLockPolicy::acquire_rlock(state_);
    return true;
  }